

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool __thiscall
absl::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  uint uVar1;
  StringPtrConvertResult SVar2;
  FormatSinkImpl *sink_00;
  wchar_t *pwVar3;
  undefined8 extraout_RDX;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  CVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  FormatSinkImpl *this_00;
  byte bVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  string_view value;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  Storage local_140;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_);
  local_140.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_0UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((long)v * 4);
  local_140.data_ =
       FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
                 (&local_140);
  bVar11 = v != (wchar_t *)0x0;
  if (v == (wchar_t *)0x0) {
    CVar4.super_Storage<unsigned_long,_0UL,_false>.value = (Storage<unsigned_long,_0UL,_false>)0;
  }
  else {
    sink_00 = (FormatSinkImpl *)-(long)v;
    CVar4.super_Storage<unsigned_long,_0UL,_false>.value = (Storage<unsigned_long,_0UL,_false>)0;
    uVar5 = 0;
    bVar6 = false;
    pwVar3 = (wchar_t *)0x1;
    do {
      if ((ulong)local_140.size_alloc_.
                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                 .super_Storage<unsigned_long,_0UL,_false>.value <=
          (ulong)CVar4.super_Storage<unsigned_long,_0UL,_false>.value) {
        _GLOBAL__N_1::ConvertStringArg();
        conv_00.precision_ = (int)extraout_RDX;
        conv_00.conv_ = SUB81(CVar4.super_Storage<unsigned_long,_0UL,_false>.value,0);
        conv_00.flags_ = (char)((ulong)CVar4.super_Storage<unsigned_long,_0UL,_false>.value >> 8);
        conv_00.length_mod_ =
             (char)((ulong)CVar4.super_Storage<unsigned_long,_0UL,_false>.value >> 0x10);
        conv_00._3_1_ = (char)((ulong)CVar4.super_Storage<unsigned_long,_0UL,_false>.value >> 0x18);
        conv_00.width_ = (int)((ulong)CVar4.super_Storage<unsigned_long,_0UL,_false>.value >> 0x20);
        SVar2 = str_format_internal::FormatConvertImpl((char *)0x0,conv_00,sink_00);
        return SVar2.value;
      }
      uVar1 = *(uint *)(this + (long)pwVar3 * 4 + -4);
      bVar8 = (byte)uVar1;
      if (uVar1 < 0x80) {
        local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] = bVar8;
        lVar10 = 1;
LAB_00157094:
        bVar12 = false;
      }
      else {
        if (uVar1 < 0x800) {
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 6) | 0xc0;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               bVar8 & 0x3f | 0x80;
          lVar10 = 2;
          goto LAB_00157094;
        }
        if (uVar1 < 0xd800 || (uVar1 & 0xffffe000) == 0xe000) {
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 0xc) | 0xe0;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
               bVar8 & 0x3f | 0x80;
          lVar10 = 3;
          goto LAB_00157094;
        }
        if (uVar1 - 0x10000 < 0x100000) {
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 0x12) | 0xf0;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
               (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 3] =
               bVar8 & 0x3f | 0x80;
          lVar10 = 4;
          goto LAB_00157094;
        }
        if (uVar1 < 0xdc00) {
          uVar5 = uVar1 & 0xffffff03;
          uVar7 = (uVar1 >> 6 & 0xf) + 1;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)uVar7 >> 2 | 0xf0;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 2) & 0xf | (byte)((uVar7 & 3) << 4) | 0x80;
          lVar10 = 2;
          bVar6 = true;
          goto LAB_00157094;
        }
        lVar10 = -1;
        bVar12 = true;
        if ((uVar1 < 0xe000) && (bVar6)) {
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 6) & 0xf | (char)uVar5 << 4 | 0x80;
          local_140.data_[(long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               bVar8 & 0x3f | 0x80;
          lVar10 = 2;
          bVar6 = false;
          uVar5 = 0;
          goto LAB_00157094;
        }
      }
      lVar9 = 0;
      if (!bVar12) {
        lVar9 = lVar10;
      }
      CVar4.super_Storage<unsigned_long,_0UL,_false>.value =
           (Storage<unsigned_long,_0UL,_false>)
           ((long)CVar4.super_Storage<unsigned_long,_0UL,_false>.value + lVar9);
      if (bVar12) break;
      bVar11 = pwVar3 < v;
      bVar12 = pwVar3 != v;
      pwVar3 = (wchar_t *)((long)pwVar3 + 1);
    } while (bVar12);
  }
  if (bVar11) {
    bVar11 = false;
  }
  else {
    bVar8 = (byte)(len >> 8);
    if (bVar8 == 0) {
      v_00._M_str = local_140.data_;
      v_00._M_len = (size_t)CVar4.super_Storage<unsigned_long,_0UL,_false>.value;
      FormatSinkImpl::Append(this_00,v_00);
      bVar11 = true;
    }
    else {
      value._M_str = local_140.data_;
      value._M_len = (size_t)CVar4.super_Storage<unsigned_long,_0UL,_false>.value;
      bVar11 = FormatSinkImpl::PutPaddedString
                         (this_00,value,(int)(len >> 0x20),conv._0_4_,(bool)(bVar8 & 1));
    }
  }
  if (0x100 < (ulong)local_140.size_alloc_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                     .super_Storage<unsigned_long,_0UL,_false>.value) {
    operator_delete(local_140.data_,
                    (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value);
  }
  return bVar11;
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}